

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::VariableCount::handle(VariableCount *this,Module *m)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *__k;
  mapped_type *pmVar3;
  int __c;
  __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
  *__rhs;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  iterator __end3;
  iterator __begin3;
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  *__range3;
  Module *m_local;
  VariableCount *this_local;
  
  __end3 = std::
           vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ::begin(&m->variables_);
  v = (variant<hgdb::json::Variable,_unsigned_long> *)
      std::
      vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
      ::end(&m->variables_);
  while( true ) {
    __rhs = (__normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
             *)&v;
    bVar1 = __gnu_cxx::operator!=(&__end3,__rhs);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
              ::operator*(&__end3);
    pcVar2 = std::variant<hgdb::json::Variable,_unsigned_long>::index(this_00,(char *)__rhs,__c);
    if (pcVar2 == (char *)0x0) {
      __k = std::get<0ul,hgdb::json::Variable,unsigned_long>(this_00);
      pmVar3 = std::
               unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
               ::operator[](&this->count,__k);
      *pmVar3 = *pmVar3 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::variant<hgdb::json::Variable,_unsigned_long>_*,_std::vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void handle(Module *m) override {
            for (auto const &v : m->variables_) {
                if (v.index() == 0) {
                    count[std::get<0>(v)]++;
                }
            }
        }